

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

ValidateXrHandleResult VerifyXrSwapchainHandle(XrSwapchain *handle_to_check)

{
  ValidateXrHandleResult VVar1;
  XrSwapchain *handle_to_check_local;
  
  VVar1 = HandleInfoBase<XrSwapchain_T_*,_GenValidUsageXrHandleInfo>::verifyHandle
                    (&g_swapchain_info.
                      super_HandleInfoBase<XrSwapchain_T_*,_GenValidUsageXrHandleInfo>,
                     handle_to_check);
  return VVar1;
}

Assistant:

ValidateXrHandleResult VerifyXrSwapchainHandle(const XrSwapchain* handle_to_check) {
    return g_swapchain_info.verifyHandle(handle_to_check);
}